

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clone.cpp
# Opt level: O2

void __thiscall helics::apps::Clone::generateInterfaces(Clone *this)

{
  element_type *peVar1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  pointer pcVar2;
  helics *this_00;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pub;
  pointer pbVar4;
  string_view key;
  string_view sourceEndpoint;
  string_view target;
  string_view target_00;
  string_view queryres;
  string_view target_01;
  string_view queryres_00;
  string_view queryres_01;
  string_view target_02;
  string_view queryStr;
  string_view queryStr_00;
  string_view queryStr_01;
  string_view queryStr_02;
  string_view fedName;
  string local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  epts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pubs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  string local_40;
  
  peVar1 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Federate::enterInitializingModeIterative
            ((Federate *)
             ((long)&(peVar1->super_ValueFederate)._vptr_ValueFederate +
             (long)(peVar1->super_ValueFederate)._vptr_ValueFederate[-3]));
  peVar1 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  target._M_str = "root";
  target._M_len = 4;
  queryStr._M_str = "global_flush";
  queryStr._M_len = 0xc;
  Federate::query_abi_cxx11_
            (&local_40,
             (Federate *)
             ((long)&(peVar1->super_ValueFederate)._vptr_ValueFederate +
             (long)(peVar1->super_ValueFederate)._vptr_ValueFederate[-3]),target,queryStr,
             HELICS_SEQUENCING_MODE_ORDERED);
  std::__cxx11::string::~string((string *)&local_40);
  peVar1 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar2 = (this->captureFederate)._M_dataplus._M_p;
  target_00._M_str = pcVar2;
  target_00._M_len = (this->captureFederate)._M_string_length;
  queryStr_00._M_str = "publications";
  queryStr_00._M_len = 0xc;
  Federate::query_abi_cxx11_
            (&local_a8,
             (Federate *)
             ((long)&(peVar1->super_ValueFederate)._vptr_ValueFederate +
             (long)(peVar1->super_ValueFederate)._vptr_ValueFederate[-3]),target_00,queryStr_00,
             HELICS_SEQUENCING_MODE_ORDERED);
  queryres._M_str = pcVar2;
  queryres._M_len = (size_t)local_a8._M_dataplus._M_p;
  vectorizeQueryResult_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&pubs,(helics *)local_a8._M_string_length,queryres);
  std::__cxx11::string::~string((string *)&local_a8);
  for (pbVar4 = pubs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar4 != pubs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar4 = pbVar4 + 1) {
    if (pbVar4->_M_string_length != 0) {
      key._M_str = (pbVar4->_M_dataplus)._M_p;
      key._M_len = pbVar4->_M_string_length;
      addSubscription(this,key);
    }
  }
  peVar1 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar2 = (this->captureFederate)._M_dataplus._M_p;
  pcVar3 = (char *)0x9;
  target_01._M_str = pcVar2;
  target_01._M_len = (this->captureFederate)._M_string_length;
  queryStr_01._M_str = "endpoints";
  queryStr_01._M_len = 9;
  Federate::query_abi_cxx11_
            (&local_a8,
             (Federate *)
             ((long)&(peVar1->super_ValueFederate)._vptr_ValueFederate +
             (long)(peVar1->super_ValueFederate)._vptr_ValueFederate[-3]),target_01,queryStr_01,
             HELICS_SEQUENCING_MODE_ORDERED);
  queryres_00._M_str = pcVar2;
  queryres_00._M_len = (size_t)local_a8._M_dataplus._M_p;
  vectorizeQueryResult_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&epts,(helics *)local_a8._M_string_length,queryres_00);
  std::__cxx11::string::~string((string *)&local_a8);
  for (pbVar4 = epts.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar4 != epts.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar4 = pbVar4 + 1) {
    if (pbVar4->_M_string_length != 0) {
      sourceEndpoint._M_str = (pbVar4->_M_dataplus)._M_p;
      sourceEndpoint._M_len = pbVar4->_M_string_length;
      addSourceEndpointClone(this,sourceEndpoint);
    }
  }
  peVar1 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    this_00 = (helics *)0x0;
  }
  else {
    this_00 = (helics *)
              ((long)&(peVar1->super_ValueFederate)._vptr_ValueFederate +
              (long)(peVar1->super_ValueFederate)._vptr_ValueFederate[-3]);
  }
  pcVar2 = (this->captureFederate)._M_dataplus._M_p;
  fedName._M_str = pcVar3;
  fedName._M_len = (size_t)pcVar2;
  queryFederateSubscriptions_abi_cxx11_
            (&local_a8,this_00,(Federate *)(this->captureFederate)._M_string_length,fedName);
  queryres_01._M_str = pcVar2;
  queryres_01._M_len = (size_t)local_a8._M_dataplus._M_p;
  vectorizeQueryResult_abi_cxx11_(&local_58,(helics *)local_a8._M_string_length,queryres_01);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&this->cloneSubscriptionNames,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_58);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_58);
  std::__cxx11::string::~string((string *)&local_a8);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  __first = std::
            __remove_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      ((this->cloneSubscriptionNames).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->cloneSubscriptionNames).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_a8);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(&this->cloneSubscriptionNames,(const_iterator)__first._M_current,
          (this->cloneSubscriptionNames).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::string::~string((string *)&local_a8);
  peVar1 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  target_02._M_str = (this->captureFederate)._M_dataplus._M_p;
  target_02._M_len = (this->captureFederate)._M_string_length;
  queryStr_02._M_str = "config";
  queryStr_02._M_len = 6;
  Federate::query_abi_cxx11_
            (&local_a8,
             (Federate *)
             ((long)&(peVar1->super_ValueFederate)._vptr_ValueFederate +
             (long)(peVar1->super_ValueFederate)._vptr_ValueFederate[-3]),target_02,queryStr_02,
             HELICS_SEQUENCING_MODE_ORDERED);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->fedConfig,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&epts);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&pubs);
  return;
}

Assistant:

void Clone::generateInterfaces()
{
    fed->enterInitializingModeIterative();

    fed->query("root", "global_flush", HELICS_SEQUENCING_MODE_ORDERED);
    auto pubs = vectorizeQueryResult(
        fed->query(captureFederate, "publications", HELICS_SEQUENCING_MODE_ORDERED));
    for (auto& pub : pubs) {
        if (pub.empty()) {
            continue;
        }
        addSubscription(pub);
    }
    auto epts = vectorizeQueryResult(
        fed->query(captureFederate, "endpoints", HELICS_SEQUENCING_MODE_ORDERED));
    for (auto& ept : epts) {
        if (ept.empty()) {
            continue;
        }
        addSourceEndpointClone(ept);
    }
    cloneSubscriptionNames =
        vectorizeQueryResult(queryFederateSubscriptions(fed.get(), captureFederate));
    // get rid of any empty strings that may have come to be
    cloneSubscriptionNames.erase(std::remove(cloneSubscriptionNames.begin(),
                                             cloneSubscriptionNames.end(),
                                             std::string{}),
                                 cloneSubscriptionNames.end());

    fedConfig = fed->query(captureFederate, "config", HELICS_SEQUENCING_MODE_ORDERED);
}